

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderRenderCase.cpp
# Opt level: O1

void __thiscall
deqp::ShaderRenderCase::computeVertexReference
          (ShaderRenderCase *this,Surface *result,QuadGrid *quadGrid)

{
  uint uVar1;
  int i_4;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined8 *puVar4;
  undefined4 extraout_var_00;
  int i_1;
  undefined8 *puVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  int x;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  bool bVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  Vec4 color;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colors;
  Vector<float,_4> res_3;
  Vector<float,_4> res_4;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  Vector<float,_4> res_2;
  Vec4 c10;
  Vec4 c01;
  Vec4 c00;
  Vec4 c11;
  ShaderEvalContext evalCtx;
  float local_358 [7];
  float local_33c;
  uint local_338;
  float local_334;
  float local_330;
  float local_32c;
  undefined1 local_328 [16];
  ulong local_310;
  ShaderRenderCase *local_308;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_300;
  ulong local_2e8;
  ulong local_2e0;
  float local_2d8 [20];
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  ShaderEvalContext local_240;
  
  iVar9 = result->m_width;
  iVar12 = result->m_height;
  uVar1 = quadGrid->m_gridSize;
  uVar6 = uVar1 + 1;
  local_308 = this;
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar2 = *(int *)(CONCAT44(extraout_var,iVar2) + 0x14);
  ShaderEvalContext::ShaderEvalContext(&local_240,quadGrid);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_300,(long)(int)(uVar6 * uVar6),(allocator_type *)&local_268);
  if ((ulong)uVar1 < 0x7fffffff) {
    lVar7 = 0;
    uVar14 = 0;
    do {
      local_328._0_4_ = (float)(int)uVar14 / (float)(int)uVar1;
      uVar10 = 0;
      do {
        ShaderEvalContext::reset
                  (&local_240,(float)(int)uVar10 / (float)(int)uVar1,(float)local_328._0_4_);
        (*local_308->m_evaluator->_vptr_ShaderEvaluator[2])(local_308->m_evaluator,&local_240);
        fVar17 = local_240.color.m_data[3];
        if (iVar2 < 1) {
          fVar17 = 1.0;
        }
        iVar3 = (int)lVar7 + (int)uVar10;
        local_300.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar3].m_data[2] = local_240.color.m_data[2];
        *(undefined8 *)
         local_300.
         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
         super__Vector_impl_data._M_start[iVar3].m_data = local_240.color.m_data._0_8_;
        local_300.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar3].m_data[3] = fVar17;
        uVar10 = uVar10 + 1;
      } while (uVar6 != uVar10);
      lVar7 = lVar7 + (ulong)uVar6;
      bVar13 = uVar14 != uVar1;
      uVar14 = uVar14 + 1;
    } while (bVar13);
  }
  if (0 < (int)uVar1) {
    fVar17 = (float)(int)uVar1;
    local_334 = (float)iVar9;
    local_33c = (float)iVar12;
    uVar8 = 0;
    uVar14 = 0;
    do {
      uVar11 = uVar14 + 1;
      local_32c = ((float)(int)uVar14 / fVar17) * local_33c;
      fVar25 = ((float)(int)uVar11 / fVar17) * local_33c;
      local_330 = 1.0 / (fVar25 - local_32c);
      fVar18 = ceilf(local_32c + -0.5);
      fVar25 = ceilf(fVar25 + -0.5);
      local_2e8 = (ulong)(uVar14 * uVar6);
      local_310 = (ulong)(uVar11 * uVar6);
      local_2e0 = 0;
      local_338 = uVar11;
      do {
        iVar12 = (int)local_2e0;
        local_2e0 = local_2e0 + 1;
        fVar22 = ((float)iVar12 / fVar17) * local_334;
        fVar20 = ((float)(int)local_2e0 / fVar17) * local_334;
        local_328._0_4_ = fVar20;
        fVar20 = ceilf(fVar20 + -0.5);
        iVar9 = (int)local_2e8;
        iVar2 = (int)local_310;
        fVar19 = ceilf(fVar22 + -0.5);
        local_268 = *(undefined8 *)
                     local_300.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar9 + iVar12].m_data;
        uStack_260 = *(undefined8 *)
                      (local_300.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar9 + iVar12].m_data + 2);
        local_278 = *(undefined8 *)
                     local_300.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar9 + iVar12 + 1].m_data;
        uStack_270 = *(undefined8 *)
                      (local_300.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar9 + iVar12 + 1].m_data + 2);
        local_288 = *(undefined8 *)
                     local_300.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar2 + iVar12].m_data;
        uStack_280 = *(undefined8 *)
                      (local_300.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar2 + iVar12].m_data + 2);
        local_258 = *(undefined8 *)
                     local_300.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(int)local_310 + iVar12 + 1].m_data;
        uStack_250 = *(undefined8 *)
                      (local_300.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(int)local_310 + iVar12 + 1].m_data
                      + 2);
        if ((int)fVar18 < (int)fVar25) {
          fVar21 = (float)local_328._0_4_ - fVar22;
          iVar9 = (int)fVar18;
          do {
            if ((int)fVar19 < (int)fVar20) {
              fVar26 = (((float)iVar9 + 0.5) - local_32c) * local_330;
              fVar27 = 1.0;
              if (fVar26 <= 1.0) {
                fVar27 = fVar26;
              }
              fVar27 = (float)(-(uint)(0.0 < fVar26) & (uint)fVar27);
              local_328 = ZEXT416((uint)fVar27);
              fVar26 = fVar27;
              iVar12 = (int)fVar19;
              do {
                fVar23 = (((float)iVar12 + 0.5) - fVar22) * (1.0 / fVar21);
                fVar24 = 1.0;
                if (fVar23 <= 1.0) {
                  fVar24 = fVar23;
                }
                fVar24 = (float)(-(uint)(0.0 < fVar23) & (uint)fVar24);
                fVar23 = fVar24 + fVar26;
                puVar4 = &local_258;
                if (fVar23 <= 1.0) {
                  puVar4 = &local_268;
                }
                puVar5 = &local_288;
                if (fVar23 <= 1.0) {
                  puVar5 = &local_278;
                }
                local_2d8[8] = 0.0;
                local_2d8[9] = 0.0;
                local_2d8[10] = 0.0;
                local_2d8[0xb] = 0.0;
                lVar7 = 0;
                do {
                  local_2d8[lVar7 + 8] =
                       *(float *)((long)puVar5 + lVar7 * 4) - *(float *)((long)puVar4 + lVar7 * 4);
                  lVar7 = lVar7 + 1;
                } while (lVar7 != 4);
                if (1.0 < fVar23) {
                  fVar24 = 1.0 - fVar24;
                }
                local_2d8[0xc] = 0.0;
                local_2d8[0xd] = 0.0;
                local_2d8[0xe] = 0.0;
                local_2d8[0xf] = 0.0;
                lVar7 = 0;
                do {
                  local_2d8[lVar7 + 0xc] = local_2d8[lVar7 + 8] * fVar24;
                  lVar7 = lVar7 + 1;
                } while (lVar7 != 4);
                local_2d8[0x10] = 0.0;
                local_2d8[0x11] = 0.0;
                local_2d8[0x12] = 0.0;
                local_2d8[0x13] = 0.0;
                lVar7 = 0;
                do {
                  local_2d8[lVar7 + 0x10] =
                       *(float *)((long)puVar4 + lVar7 * 4) + local_2d8[lVar7 + 0xc];
                  lVar7 = lVar7 + 1;
                } while (lVar7 != 4);
                puVar5 = &local_278;
                if (fVar23 <= 1.0) {
                  puVar5 = &local_288;
                }
                local_2d8[0] = 0.0;
                local_2d8[1] = 0.0;
                local_2d8[2] = 0.0;
                local_2d8[3] = 0.0;
                lVar7 = 0;
                do {
                  local_2d8[lVar7] =
                       *(float *)((long)puVar5 + lVar7 * 4) - *(float *)((long)puVar4 + lVar7 * 4);
                  lVar7 = lVar7 + 1;
                } while (lVar7 != 4);
                local_2d8[4] = 0.0;
                local_2d8[5] = 0.0;
                local_2d8[6] = 0.0;
                local_2d8[7] = 0.0;
                lVar7 = 0;
                do {
                  local_2d8[lVar7 + 4] =
                       local_2d8[lVar7] *
                       (float)(~-(uint)(fVar23 <= 1.0) & (uint)(1.0 - fVar27) |
                              -(uint)(fVar23 <= 1.0) & (uint)fVar26);
                  lVar7 = lVar7 + 1;
                } while (lVar7 != 4);
                local_358[0] = 0.0;
                local_358[1] = 0.0;
                local_358[2] = 0.0;
                local_358[3] = 0.0;
                lVar7 = 0;
                do {
                  local_358[lVar7] = local_2d8[lVar7 + 0x10] + local_2d8[lVar7 + 4];
                  lVar7 = lVar7 + 1;
                } while (lVar7 != 4);
                iVar2 = (*local_308->m_renderCtx->_vptr_RenderContext[4])();
                if (*(int *)(CONCAT44(extraout_var_00,iVar2) + 0x14) == 1) {
                  fVar26 = floorf(local_358[3] + 0.5);
                  local_358[3] = fVar26;
                }
                uVar14 = -(uint)(local_358[0] * 255.0 < 0.0);
                uVar14 = (uint)((float)(~uVar14 & 0x3f000000 | uVar14 & 0xbf000000) +
                               local_358[0] * 255.0);
                if (0xfe < (int)uVar14) {
                  uVar14 = 0xff;
                }
                if ((int)uVar14 < 1) {
                  uVar14 = uVar8;
                }
                uVar11 = -(uint)(local_358[1] * 255.0 < 0.0);
                uVar11 = (uint)((float)(~uVar11 & 0x3f000000 | uVar11 & 0xbf000000) +
                               local_358[1] * 255.0);
                if (0xfe < (int)uVar11) {
                  uVar11 = 0xff;
                }
                if ((int)uVar11 < 1) {
                  uVar11 = uVar8;
                }
                uVar15 = -(uint)(local_358[2] * 255.0 < 0.0);
                uVar15 = (uint)((float)(~uVar15 & 0x3f000000 | uVar15 & 0xbf000000) +
                               local_358[2] * 255.0);
                if (0xfe < (int)uVar15) {
                  uVar15 = 0xff;
                }
                if ((int)uVar15 < 1) {
                  uVar15 = uVar8;
                }
                uVar16 = -(uint)(local_358[3] * 255.0 < 0.0);
                iVar2 = (int)((float)(~uVar16 & 0x3f000000 | uVar16 & 0xbf000000) +
                             local_358[3] * 255.0);
                if (0xfe < iVar2) {
                  iVar2 = 0xff;
                }
                if (iVar2 < 1) {
                  iVar2 = 0;
                }
                *(uint *)((long)(result->m_pixels).m_ptr +
                         (long)(result->m_width * iVar9 + iVar12) * 4) =
                     uVar15 << 0x10 | iVar2 << 0x18 | uVar11 << 8 | uVar14;
                iVar12 = iVar12 + 1;
                fVar26 = (float)local_328._0_4_;
              } while (iVar12 != (int)fVar20);
            }
            iVar9 = iVar9 + 1;
          } while (iVar9 != (int)fVar25);
        }
      } while (local_2e0 != uVar1);
      uVar14 = local_338;
    } while (local_338 != uVar1);
  }
  if (local_300.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_300.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_300.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_300.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ShaderRenderCase::computeVertexReference(Surface& result, const QuadGrid& quadGrid)
{
	// Buffer info.
	int				  width	= result.getWidth();
	int				  height   = result.getHeight();
	int				  gridSize = quadGrid.getGridSize();
	int				  stride   = gridSize + 1;
	bool			  hasAlpha = m_renderCtx.getRenderTarget().getPixelFormat().alphaBits > 0;
	ShaderEvalContext evalCtx(quadGrid);

	// Evaluate color for each vertex.
	vector<Vec4> colors((gridSize + 1) * (gridSize + 1));
	for (int y = 0; y < gridSize + 1; y++)
		for (int x = 0; x < gridSize + 1; x++)
		{
			float sx	 = static_cast<float>(x) / static_cast<float>(gridSize);
			float sy	 = static_cast<float>(y) / static_cast<float>(gridSize);
			int   vtxNdx = ((y * (gridSize + 1)) + x);

			evalCtx.reset(sx, sy);
			m_evaluator.evaluate(evalCtx);
			DE_ASSERT(!evalCtx.isDiscarded); // Discard is not available in vertex shader.
			Vec4 color = evalCtx.color;

			if (!hasAlpha)
				color.w() = 1.0f;

			colors[vtxNdx] = color;
		}

	// Render quads.
	for (int y = 0; y < gridSize; y++)
		for (int x = 0; x < gridSize; x++)
		{
			float x0 = static_cast<float>(x) / static_cast<float>(gridSize);
			float x1 = static_cast<float>(x + 1) / static_cast<float>(gridSize);
			float y0 = static_cast<float>(y) / static_cast<float>(gridSize);
			float y1 = static_cast<float>(y + 1) / static_cast<float>(gridSize);

			float sx0  = x0 * (float)width;
			float sx1  = x1 * (float)width;
			float sy0  = y0 * (float)height;
			float sy1  = y1 * (float)height;
			float oosx = 1.0f / (sx1 - sx0);
			float oosy = 1.0f / (sy1 - sy0);

			int ix0 = deCeilFloatToInt32(sx0 - 0.5f);
			int ix1 = deCeilFloatToInt32(sx1 - 0.5f);
			int iy0 = deCeilFloatToInt32(sy0 - 0.5f);
			int iy1 = deCeilFloatToInt32(sy1 - 0.5f);

			int  v00 = (y * stride) + x;
			int  v01 = (y * stride) + x + 1;
			int  v10 = ((y + 1) * stride) + x;
			int  v11 = ((y + 1) * stride) + x + 1;
			Vec4 c00 = colors[v00];
			Vec4 c01 = colors[v01];
			Vec4 c10 = colors[v10];
			Vec4 c11 = colors[v11];

			//printf("(%d,%d) -> (%f..%f, %f..%f) (%d..%d, %d..%d)\n", x, y, sx0, sx1, sy0, sy1, ix0, ix1, iy0, iy1);

			for (int iy = iy0; iy < iy1; iy++)
				for (int ix = ix0; ix < ix1; ix++)
				{
					DE_ASSERT(deInBounds32(ix, 0, width));
					DE_ASSERT(deInBounds32(iy, 0, height));

					float sfx = (float)ix + 0.5f;
					float sfy = (float)iy + 0.5f;
					float fx1 = deFloatClamp((sfx - sx0) * oosx, 0.0f, 1.0f);
					float fy1 = deFloatClamp((sfy - sy0) * oosy, 0.0f, 1.0f);

					// Triangle quad interpolation.
					bool		tri   = fx1 + fy1 <= 1.0f;
					float		tx	= tri ? fx1 : (1.0f - fx1);
					float		ty	= tri ? fy1 : (1.0f - fy1);
					const Vec4& t0	= tri ? c00 : c11;
					const Vec4& t1	= tri ? c01 : c10;
					const Vec4& t2	= tri ? c10 : c01;
					Vec4		color = t0 + (t1 - t0) * tx + (t2 - t0) * ty;

					// Quantizing for 1-bit alpha
					if ((m_renderCtx.getRenderTarget().getPixelFormat().alphaBits) == 1)
						color.w() = deFloatRound(color.w());

					result.setPixel(ix, iy, toRGBA(color));
				}
		}
}